

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

void trm_lysc_tree_ctx(lys_module *module,ly_out *out,size_t max_line_length,trt_printer_ctx *pc,
                      trt_tree_ctx *tc)

{
  lysp_module *plVar1;
  lysc_module *plVar2;
  lysc_node *plVar3;
  
  plVar1 = module->parsed;
  plVar2 = module->compiled;
  plVar3 = plVar2->data;
  tc->lysc_tree = '\x01';
  tc->section = TRD_SECT_MODULE;
  tc->pmod = plVar1;
  tc->cmod = plVar2;
  tc->pn = (lysp_node *)0x0;
  tc->tpn = (lysp_node *)0x0;
  tc->cn = plVar3;
  tc->last_error = LY_SUCCESS;
  (tc->plugin_ctx).ctx = (lyspr_tree_ctx *)0x0;
  (tc->plugin_ctx).schema = (lyspr_tree_schema *)0x0;
  (tc->plugin_ctx).filtered = '\0';
  (tc->plugin_ctx).node_overr.flags = (char *)0x0;
  (tc->plugin_ctx).node_overr.add_opts = (char *)0x0;
  (tc->plugin_ctx).last_schema = '\x01';
  (tc->plugin_ctx).last_error = '\0';
  pc->out = out;
  (pc->fp).modify.parent = troc_modi_parent;
  (pc->fp).modify.first_sibling = troc_modi_first_sibling;
  (pc->fp).modify.next_sibling = troc_modi_next_sibling;
  (pc->fp).modify.next_child = troc_modi_next_child;
  (pc->fp).read.module_name = tro_read_module_name;
  (pc->fp).read.node = troc_read_node;
  (pc->fp).read.if_sibling_exists = troc_read_if_sibling_exists;
  (pc->fp).read.if_parent_exists = tro_read_if_sibling_exists;
  (pc->fp).print.print_features_names = tro_print_features_names;
  (pc->fp).print.print_keys = tro_print_keys;
  pc->max_line_length = max_line_length;
  return;
}

Assistant:

static void
trm_lysc_tree_ctx(const struct lys_module *module, struct ly_out *out, size_t max_line_length,
        struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    *tc = (struct trt_tree_ctx) {
        .lysc_tree = 1,
        .section = TRD_SECT_MODULE,
        .pmod = module->parsed,
        .cmod = module->compiled,
        .tpn = NULL,
        .pn = NULL,
        .cn = module->compiled->data,
        .last_error = 0,
        .plugin_ctx = {
            .ctx = NULL,
            .schema = NULL,
            .filtered = 0,
            .node_overr = TRP_TREE_CTX_EMPTY_NODE_OVERR,
            .last_schema = 1,
            .last_error = 0
        }

    };

    pc->out = out;

    pc->fp.modify = TRP_TRT_FP_MODIFY_COMPILED;
    pc->fp.read = TRP_TRT_FP_READ_COMPILED;

    pc->fp.print = (struct trt_fp_print) {
        .print_features_names = tro_print_features_names,
        .print_keys = tro_print_keys
    };

    pc->max_line_length = max_line_length;
}